

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmElfRelocator.cpp
# Opt level: O0

bool __thiscall
ArmElfRelocator::relocateOpcode
          (ArmElfRelocator *this,int type,RelocationData *data,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar1;
  int iVar2;
  uint uVar3;
  bool local_d9;
  string local_d8;
  string local_b8;
  uint local_94;
  int local_90;
  int value_1;
  int a_1;
  int opField_1;
  int condField;
  string local_78;
  int local_58;
  int local_54;
  int value;
  int a;
  int opField;
  unsigned_short second;
  unsigned_short first;
  uint32_t opcode;
  int s;
  int p;
  int t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  vector<RelocationAction,_std::allocator<RelocationAction>_> *actions_local;
  RelocationData *data_local;
  ArmElfRelocator *pAStack_18;
  int type_local;
  ArmElfRelocator *this_local;
  
  local_d9 = false;
  if (data->targetSymbolType == 2) {
    local_d9 = data->targetSymbolInfo != 0;
  }
  s = (int)local_d9;
  opcode = (uint32_t)data->opcodeOffset;
  _second = (int)data->relocationBase;
  opField = data->opcode;
  _p = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors;
  errors_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)actions;
  actions_local = (vector<RelocationAction,_std::allocator<RelocationAction>_> *)data;
  data_local._4_4_ = type;
  pAStack_18 = this;
  switch(type) {
  case 2:
  case 0x26:
    opField = opField + (int)data->relocationBase | s;
    break;
  default:
    tinyformat::format<int>
              (&local_d8,"Unknown ARM relocation type %d",(int *)((long)&data_local + 4));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,&local_d8
              );
    std::__cxx11::string::~string((string *)&local_d8);
    return false;
  case 10:
    a._2_2_ = (ushort)opField;
    a._0_2_ = (ushort)((uint)opField >> 0x10);
    value = (opField & 0x7ffU) << 0xb | (ushort)a & 0x7ff;
    local_54 = signExtend(value << 1,0x17);
    pvVar1 = _p;
    local_58 = (_second + local_54) - opcode;
    a._2_2_ = a._2_2_ & 0xf800;
    a._0_2_ = (ushort)a & 0xf800;
    if (s == 1) {
      if ((long)(actions_local->
                super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>)._M_impl.
                super__Vector_impl_data._M_finish % 2 != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[39]>(_p,(char (*) [39])"Branch target must be halfword aligned");
        return false;
      }
    }
    else {
      if ((this->arm9 & 1U) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[54]>
                  (_p,(char (*) [54])"Cannot call ARM function from THUMB code without stub");
        return false;
      }
      if ((long)(actions_local->
                super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>)._M_impl.
                super__Vector_impl_data._M_finish % 4 != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[35]>(_p,(char (*) [35])"Branch target must be word aligned");
        return false;
      }
      a._0_2_ = 0xe800;
    }
    iVar2 = local_58;
    if (local_58 < 1) {
      iVar2 = -local_58;
    }
    if (0x3fffff < iVar2) {
      tinyformat::format<long>
                (&local_78,"Branch target %08X out of range",
                 (long *)&(actions_local->
                          super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>).
                          _M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      return false;
    }
    a._2_2_ = a._2_2_ | (ushort)(local_58 >> 0xc) & 0x7ff;
    a._0_2_ = (ushort)a | (ushort)(local_58 >> 1) & 0x7ff;
    opField = CONCAT22((ushort)a,a._2_2_);
    local_58 = local_58 >> 1;
    break;
  case 0x1c:
  case 0x1d:
    a_1 = (uint)opField >> 0x1c;
    value_1 = (opField & 0xffffffU) << 2;
    opField = opField & 0xff000000;
    local_90 = signExtend(value_1,0x1a);
    pvVar1 = _p;
    local_94 = (_second + local_90) - opcode;
    if (s == 1) {
      if ((long)(actions_local->
                super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>)._M_impl.
                super__Vector_impl_data._M_finish % 2 != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[39]>(_p,(char (*) [39])"Branch target must be halfword aligned");
        return false;
      }
      if (data_local._4_4_ == 0x1d) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[43]>
                  (_p,(char (*) [43])"Cannot jump from ARM to THUMB without link");
        return false;
      }
      if ((this->arm9 & 1U) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[54]>
                  (_p,(char (*) [54])"Cannot call THUMB function from ARM code without stub");
        return false;
      }
      if (a_1 != 0xe) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[39]>(_p,(char (*) [39])"Cannot convert conditional bl into blx");
        return false;
      }
      opField = -0x6000000;
      if ((local_94 & 2) != 0) {
        opField = -0x5000000;
      }
    }
    else if ((long)(actions_local->
                   super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>)._M_impl.
                   super__Vector_impl_data._M_finish % 4 != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[35]>(_p,(char (*) [35])"Branch target must be word aligned");
      return false;
    }
    uVar3 = local_94;
    if ((int)local_94 < 1) {
      uVar3 = -local_94;
    }
    if (0x1ffffff < (int)uVar3) {
      tinyformat::format<long>
                (&local_b8,"Branch target %08X out of range",
                 (long *)&(actions_local->
                          super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>).
                          _M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar1,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      return false;
    }
    opField = (int)local_94 >> 2 & 0xffffffU | opField;
  }
  std::vector<RelocationAction,std::allocator<RelocationAction>>::
  emplace_back<long_const&,unsigned_int&>
            ((vector<RelocationAction,std::allocator<RelocationAction>> *)errors_local,
             (long *)actions_local,(uint *)&opField);
  return true;
}

Assistant:

bool ArmElfRelocator::relocateOpcode(int type, const RelocationData& data, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	int t = (data.targetSymbolType == STT_FUNC && data.targetSymbolInfo != 0) ? 1 : 0;
	int p = (int) data.opcodeOffset;
	int s = (int) data.relocationBase;

	uint32_t opcode = data.opcode;
	switch (type)
	{
	case R_ARM_ABS32:		// (S + A) | T
	case R_ARM_TARGET1:
		opcode = (int) (opcode + data.relocationBase) | t;
		break;
	case R_ARM_THM_CALL:	// ((S + A) | T) - P
		{
			unsigned short first = opcode & 0xFFFF;
			unsigned short second = (opcode >> 16) & 0xFFFF;
			int opField = ((first & 0x7FF) << 11) | (second & 0x7FF);
			int a = signExtend(opField << 1,23);
			int value = (s+a) - p;

			first &= ~0x7FF;
			second &= ~0x7FF;

			if (t == 1)
			{
				if (data.relocationBase % 2)
				{
					errors.emplace_back("Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (arm9 == false)
				{
					errors.emplace_back("Cannot call ARM function from THUMB code without stub");
					return false;
				}

				if (data.relocationBase % 4)
				{
					errors.emplace_back("Branch target must be word aligned");
					return false;
				}
				
				second = 0xE800;
			}

			if (abs(value) >= 0x400000)
			{
				errors.emplace_back(tfm::format("Branch target %08X out of range",data.relocationBase));
				return false;
			}

			value >>= 1;
			first |= (value >> 11) & 0x7FF;
			second |= value & 0x7FF;
			opcode = first | (second << 16);
		}
		break;
	case R_ARM_CALL:		// ((S + A) | T) - P
	case R_ARM_JUMP24:		// ((S + A) | T) - P
		{
			int condField = (opcode >> 28) & 0xF;
			int opField = (opcode & 0xFFFFFF) << 2;
			opcode &= ~0xFFFFFF;

			int a = signExtend(opField,26);
			int value = (s+a) - p;

			if (t == 1)
			{
				if (data.relocationBase % 2)
				{
					errors.emplace_back("Branch target must be halfword aligned");
					return false;
				}

				if (type == R_ARM_JUMP24)
				{
					errors.emplace_back("Cannot jump from ARM to THUMB without link");
					return false;
				}

				if (arm9 == false)
				{
					errors.emplace_back("Cannot call THUMB function from ARM code without stub");
					return false;
				}

				if (condField != 0xE)
				{
					errors.emplace_back("Cannot convert conditional bl into blx");
					return false;
				}

				opcode = 0xFA000000;
				if (value & 2)
					opcode |= (1 << 24);
			} else {
				if (data.relocationBase % 4)
				{
					errors.emplace_back("Branch target must be word aligned");
					return false;
				}
			}
			
			if (abs(value) >= 0x2000000)
			{
				errors.emplace_back(tfm::format("Branch target %08X out of range",data.relocationBase));
				return false;
			}

			opcode |= (value >> 2) & 0xFFFFFF;
		}
		break;
	default:
		errors.emplace_back(tfm::format("Unknown ARM relocation type %d",type));
		return false;
	}

	actions.emplace_back(data.opcodeOffset, opcode);
	return true;
}